

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<long,_1,_-1,_1,_1,_-1>_>::resize
          (PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_> *this,Index size)

{
  Index size_local;
  PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_> *this_local;
  
  if (-1 < size) {
    DenseStorage<long,_-1,_1,_-1,_1>::resize(&this->m_storage,size,1,size);
    return;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/PlainObjectBase.h"
                ,0x10c,
                "void Eigen::PlainObjectBase<Eigen::Matrix<long, 1, -1, 1, 1, -1>>::resize(Index) [Derived = Eigen::Matrix<long, 1, -1, 1, 1, -1>]"
               );
}

Assistant:

inline void resize(Index size)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(PlainObjectBase)
      eigen_assert(((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0);
      #ifdef EIGEN_INITIALIZE_COEFFS
        bool size_changed = size != this->size();
      #endif
      if(RowsAtCompileTime == 1)
        m_storage.resize(size, 1, size);
      else
        m_storage.resize(size, size, 1);
      #ifdef EIGEN_INITIALIZE_COEFFS
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #endif
    }